

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> * __thiscall
GLRState::statesOnInput
          (set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>
           *__return_storage_ptr__,GLRState *this,string *input)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  size_t __n;
  int iVar3;
  GLRState *in_RAX;
  _Rb_tree_node_base *p_Var4;
  GLRState *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = in_RAX;
  for (p_Var4 = (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->statesTo)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    puVar2 = *(undefined8 **)(p_Var4 + 1);
    __n = puVar2[1];
    if ((__n == input->_M_string_length) &&
       ((__n == 0 || (iVar3 = bcmp((void *)*puVar2,(input->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
      local_38 = (GLRState *)puVar2[4];
      std::
      _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
      ::_M_insert_unique<GLRState*>
                ((_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
                  *)__return_storage_ptr__,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<GLRState *> GLRState::statesOnInput(const std::string &input) {
    std::set<GLRState *> statesOnInp;
    for (GLRTransition *state: statesTo) {
        if (state->getLabel() == input) {
            statesOnInp.insert(state->getStateTo());
        }
    }
    return statesOnInp;
}